

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv.h
# Opt level: O0

TransformationType get_wmtype(WarpedMotionParams *gm)

{
  bool bVar1;
  WarpedMotionParams *gm_local;
  TransformationType local_1;
  
  if ((((gm->wmmat[5] == 0x10000) && (gm->wmmat[4] == 0)) && (gm->wmmat[2] == 0x10000)) &&
     (gm->wmmat[3] == 0)) {
    bVar1 = false;
    if (gm->wmmat[1] == 0) {
      bVar1 = gm->wmmat[0] == 0;
    }
    local_1 = !bVar1;
  }
  else if ((gm->wmmat[2] == gm->wmmat[5]) && (gm->wmmat[3] == -gm->wmmat[4])) {
    local_1 = '\x02';
  }
  else {
    local_1 = '\x03';
  }
  return local_1;
}

Assistant:

static inline TransformationType get_wmtype(const WarpedMotionParams *gm) {
  if (gm->wmmat[5] == (1 << WARPEDMODEL_PREC_BITS) && !gm->wmmat[4] &&
      gm->wmmat[2] == (1 << WARPEDMODEL_PREC_BITS) && !gm->wmmat[3]) {
    return ((!gm->wmmat[1] && !gm->wmmat[0]) ? IDENTITY : TRANSLATION);
  }
  if (gm->wmmat[2] == gm->wmmat[5] && gm->wmmat[3] == -gm->wmmat[4])
    return ROTZOOM;
  else
    return AFFINE;
}